

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_12f2cc::BuildEngineImpl::executeTasks(BuildEngineImpl *this,KeyType *buildKey)

{
  value_type this_00;
  RuleInfo *pRVar1;
  BuildEngineDelegate *pBVar2;
  RuleScanRequest request_00;
  lock_guard<std::mutex> lVar3;
  void *pvVar4;
  TaskInfo *pTVar5;
  KeyID keyID;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  reference pvVar9;
  char *pcVar10;
  reference pvVar11;
  RuleScanRecord *this_01;
  reference pvVar12;
  reference ppTVar13;
  uint64_t uVar14;
  reference ppTVar15;
  TaskInfo *pTVar16;
  pointer pRVar17;
  __pthread_internal_list **pp_Var18;
  pointer pBVar19;
  type pRVar20;
  reference __x;
  vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
  *this_02;
  pointer pBVar21;
  pointer pTVar22;
  iterator __first;
  iterator __last;
  char cVar23;
  KeyIDAndFlags KVar24;
  byte local_369;
  undefined1 local_300 [8];
  unique_lock<std::mutex> lock;
  TracingEngineQueueItemEvent i_7;
  _Node_iterator_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
  local_2d8;
  pointer local_2d0;
  _Node_iterator_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
  local_2c8;
  iterator it;
  lock_guard<std::mutex> guard_3;
  __normal_iterator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>_>
  local_2a0;
  const_iterator local_298;
  reference local_290;
  TaskInputRequest *request_4;
  iterator __end5;
  iterator __begin5;
  vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
  *__range5;
  RuleScanRequest *request_3;
  iterator __end4_1;
  iterator __begin4_1;
  vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
  *__range4_1;
  ValueTy local_238;
  byte local_229;
  undefined1 local_228 [7];
  bool result;
  string error;
  value_type local_200;
  KeyIDAndFlags local_1e0;
  ValueTy local_1d0;
  KeyIDAndFlags dependency;
  const_iterator __end4;
  const_iterator __begin4;
  DependencyKeyIDs *__range4;
  lock_guard<std::mutex> guard_2;
  bool wasChanged;
  RuleInfo *ruleInfo_1;
  lock_guard<std::mutex> guard_1;
  TaskInfo *taskInfo_1;
  TracingEngineQueueItemEvent i_6;
  undefined1 local_158 [8];
  TaskInterface iface_1;
  TracingEngineTaskCallback i_5;
  RuleInfo *ruleInfo;
  TaskInfo *taskInfo;
  TracingEngineQueueItemEvent i_4;
  undefined1 local_118 [8];
  TaskInterface iface;
  TracingEngineTaskCallback i_3;
  value_type request_2;
  TracingEngineQueueItemEvent i_2;
  int local_cc;
  bool isAvailable;
  bool isScanned;
  lock_guard<std::mutex> guard;
  undefined1 auStack_b8 [7];
  bool found;
  TaskInputRequest request_1;
  TracingEngineQueueItemEvent i_1;
  value_type request;
  TracingEngineQueueItemEvent i;
  undefined1 auStack_40 [7];
  bool didWork;
  uintptr_t local_38;
  RuleInfo *local_30;
  bool local_28;
  bool local_27;
  bool local_26;
  KeyType *local_20;
  KeyType *buildKey_local;
  BuildEngineImpl *this_local;
  
  local_20 = buildKey;
  buildKey_local = (KeyType *)this;
  std::
  vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
  ::clear(&this->finishedInputRequests);
  _auStack_40 = (TaskInfo *)0x0;
  local_38 = 0;
  local_30 = getRuleInfoForKey(this,local_20);
  local_28 = false;
  local_27 = false;
  local_26 = false;
  std::
  deque<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
  ::push_back(&this->inputRequests,(value_type *)auStack_40);
  do {
    do {
      bVar7 = false;
      bVar6 = std::atomic::operator_cast_to_bool((atomic *)&this->buildCancelled);
      if (bVar6) {
        cancelRemainingTasks(this);
        this_local._7_1_ = 0;
        goto LAB_001a00b3;
      }
      while (bVar6 = std::
                     vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                     ::empty(&this->ruleInfosToScan), ((bVar6 ^ 0xffU) & 1) != 0) {
        pcVar10 = llbuild::core::KeyType::c_str(local_20);
        llbuild::TracingEngineQueueItemEvent::TracingEngineQueueItemEvent
                  ((TracingEngineQueueItemEvent *)&request.orderOnly,RuleToScan,pcVar10);
        bVar7 = true;
        pvVar9 = std::
                 vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                 ::back(&this->ruleInfosToScan);
        pRVar1 = pvVar9->ruleInfo;
        request.ruleInfo = *(RuleInfo **)&pvVar9->inputIndex;
        request._8_8_ = pvVar9->inputRuleInfo;
        request.inputRuleInfo = *(RuleInfo **)&pvVar9->orderOnly;
        std::
        vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
        ::pop_back(&this->ruleInfosToScan);
        request_00._8_8_ = request.ruleInfo;
        request_00.ruleInfo = pRVar1;
        request_00.inputRuleInfo = (RuleInfo *)request._8_8_;
        request_00._24_8_ = request.inputRuleInfo;
        processRuleScanRequest(this,request_00);
        llbuild::TracingEngineQueueItemEvent::~TracingEngineQueueItemEvent
                  ((TracingEngineQueueItemEvent *)&request.orderOnly);
      }
      do {
        pcVar10 = llbuild::core::KeyType::c_str(local_20);
        llbuild::TracingEngineQueueItemEvent::TracingEngineQueueItemEvent
                  ((TracingEngineQueueItemEvent *)&request_1.orderOnly,InputRequest,pcVar10);
        TaskInputRequest::TaskInputRequest((TaskInputRequest *)auStack_b8);
        guard._M_device._7_1_ = 0;
        std::lock_guard<std::mutex>::lock_guard
                  ((lock_guard<std::mutex> *)&stack0xffffffffffffff38,&this->inputRequestsMutex);
        bVar6 = std::
                deque<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                ::empty(&this->inputRequests);
        if (!bVar6) {
          pvVar11 = std::
                    deque<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                    ::front(&this->inputRequests);
          _auStack_b8 = pvVar11->taskInfo;
          request_1.taskInfo = (TaskInfo *)pvVar11->inputID;
          request_1.inputID = (uintptr_t)pvVar11->inputRuleInfo;
          request_1.inputRuleInfo._0_1_ = pvVar11->orderOnly;
          request_1.inputRuleInfo._1_1_ = pvVar11->forcePriorValue;
          request_1.inputRuleInfo._2_1_ = pvVar11->singleUse;
          std::
          deque<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
          ::pop_front(&this->inputRequests);
          guard._M_device._7_1_ = 1;
        }
        std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffff38)
        ;
        if ((guard._M_device._7_1_ & 1) == 0) {
          local_cc = 7;
        }
        else {
          bVar7 = true;
          bVar6 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->trace);
          if (bVar6) {
            if (_auStack_b8 == (TaskInfo *)0x0) {
              pBVar21 = std::
                        unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                        ::operator->(&this->trace);
              pRVar17 = std::
                        unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                        get((unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                             *)(request_1.inputID + 8));
              llbuild::core::BuildEngineTrace::handlingBuildInputRequest(pBVar21,pRVar17);
            }
            else {
              pBVar21 = std::
                        unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                        ::operator->(&this->trace);
              pTVar22 = std::
                        unique_ptr<llbuild::core::Task,_std::default_delete<llbuild::core::Task>_>::
                        get(&_auStack_b8->task);
              pRVar17 = std::
                        unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                        get((unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                             *)(request_1.inputID + 8));
              llbuild::core::BuildEngineTrace::handlingTaskInputRequest(pBVar21,pTVar22,pRVar17);
            }
          }
          bVar6 = scanRule(this,(RuleInfo *)request_1.inputID);
          if (bVar6) {
            bVar6 = demandRule(this,(RuleInfo *)request_1.inputID);
            if (_auStack_b8 == (TaskInfo *)0x0) {
              local_cc = 6;
            }
            else {
              llbuild::core::DependencyKeyIDs::push_back
                        (&(_auStack_b8->forRuleInfo->result).dependencies,
                         (KeyID)*(ValueTy *)request_1.inputID,
                         (bool)((byte)request_1.inputRuleInfo & 1),
                         (bool)(request_1.inputRuleInfo._2_1_ & 1));
              if (bVar6) {
                bVar6 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->trace);
                if (bVar6) {
                  pBVar21 = std::
                            unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                            ::operator->(&this->trace);
                  pTVar22 = std::
                            unique_ptr<llbuild::core::Task,_std::default_delete<llbuild::core::Task>_>
                            ::get(&_auStack_b8->task);
                  pRVar17 = std::
                            unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                            ::get((unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                                   *)(request_1.inputID + 8));
                  llbuild::core::BuildEngineTrace::readyingTaskInputRequest(pBVar21,pTVar22,pRVar17)
                  ;
                }
                std::
                vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                ::push_back(&this->finishedInputRequests,(value_type *)auStack_b8);
              }
              else {
                pTVar16 = RuleInfo::getPendingTaskInfo((RuleInfo *)request_1.inputID);
                if (pTVar16 == (TaskInfo *)0x0) {
                  __assert_fail("request.inputRuleInfo->getPendingTaskInfo()",
                                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                                ,0x356,
                                "bool (anonymous namespace)::BuildEngineImpl::executeTasks(const KeyType &)"
                               );
                }
                bVar6 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->trace);
                if (bVar6) {
                  pBVar21 = std::
                            unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                            ::operator->(&this->trace);
                  pRVar17 = std::
                            unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                            ::get((unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                                   *)(request_1.inputID + 8));
                  pTVar22 = std::
                            unique_ptr<llbuild::core::Task,_std::default_delete<llbuild::core::Task>_>
                            ::get(&_auStack_b8->task);
                  llbuild::core::BuildEngineTrace::addedRulePendingTask(pBVar21,pRVar17,pTVar22);
                }
                pTVar16 = RuleInfo::getPendingTaskInfo((RuleInfo *)request_1.inputID);
                std::
                vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                ::push_back(&pTVar16->requestedBy,(value_type *)auStack_b8);
              }
              local_cc = 0;
            }
          }
          else {
            bVar6 = RuleInfo::isScanning((RuleInfo *)request_1.inputID);
            if (!bVar6) {
              __assert_fail("request.inputRuleInfo->isScanning()",
                            "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                            ,800,
                            "bool (anonymous namespace)::BuildEngineImpl::executeTasks(const KeyType &)"
                           );
            }
            bVar6 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->trace);
            if (bVar6) {
              pBVar21 = std::
                        unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                        ::operator->(&this->trace);
              pRVar17 = std::
                        unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                        get((unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                             *)(request_1.inputID + 8));
              llbuild::core::BuildEngineTrace::pausedInputRequestForRuleScan(pBVar21,pRVar17);
            }
            this_01 = RuleInfo::getPendingScanRecord((RuleInfo *)request_1.inputID);
            std::
            vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
            ::push_back(&this_01->pausedInputRequests,(value_type *)auStack_b8);
            local_cc = 6;
          }
        }
        llbuild::TracingEngineQueueItemEvent::~TracingEngineQueueItemEvent
                  ((TracingEngineQueueItemEvent *)&request_1.orderOnly);
      } while ((local_cc == 0) || (local_cc == 6));
      while (bVar6 = std::
                     vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                     ::empty(&this->finishedInputRequests), ((bVar6 ^ 0xffU) & 1) != 0) {
        pcVar10 = llbuild::core::KeyType::c_str(local_20);
        llbuild::TracingEngineQueueItemEvent::TracingEngineQueueItemEvent
                  ((TracingEngineQueueItemEvent *)&request_2.orderOnly,FinishedInputRequest,pcVar10)
        ;
        bVar7 = true;
        pvVar12 = std::
                  vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                  ::back(&this->finishedInputRequests);
        pTVar16 = pvVar12->taskInfo;
        request_2.taskInfo = (TaskInfo *)pvVar12->inputID;
        request_2.inputID = (uintptr_t)pvVar12->inputRuleInfo;
        request_2.inputRuleInfo = *(RuleInfo **)&pvVar12->orderOnly;
        std::
        vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
        ::pop_back(&this->finishedInputRequests);
        bVar6 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->trace);
        if (bVar6) {
          pBVar21 = std::
                    unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                    ::operator->(&this->trace);
          pTVar22 = std::unique_ptr<llbuild::core::Task,_std::default_delete<llbuild::core::Task>_>
                    ::get(&pTVar16->task);
          pRVar17 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                    ::get((unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                           *)(request_2.inputID + 8));
          llbuild::core::BuildEngineTrace::completedTaskInputRequest(pBVar21,pTVar22,pRVar17);
        }
        bVar6 = RuleInfo::isComplete((RuleInfo *)request_2.inputID,this);
        local_369 = 1;
        if ((!bVar6) && (local_369 = 1, ((ulong)request_2.inputRuleInfo & 0x100) == 0)) {
          local_369 = (byte)request_2.inputRuleInfo;
        }
        if ((local_369 & 1) == 0) {
          __assert_fail("request.inputRuleInfo->isComplete(this) || request.forcePriorValue || request.orderOnly"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                        ,0x372,
                        "bool (anonymous namespace)::BuildEngineImpl::executeTasks(const KeyType &)"
                       );
        }
        if (((ulong)request_2.inputRuleInfo & 1) == 0) {
          uVar14 = llbuild::core::KeyID::operator_cast_to_unsigned_long((KeyID *)request_2.inputID);
          llbuild::TracingEngineTaskCallback::TracingEngineTaskCallback
                    ((TracingEngineTaskCallback *)&iface.ctx,ProvideValue,uVar14);
          pTVar22 = std::unique_ptr<llbuild::core::Task,_std::default_delete<llbuild::core::Task>_>
                    ::get(&pTVar16->task);
          llbuild::core::TaskInterface::TaskInterface((TaskInterface *)local_118,this,pTVar22);
          pTVar22 = std::unique_ptr<llbuild::core::Task,_std::default_delete<llbuild::core::Task>_>
                    ::operator->(&pTVar16->task);
          pTVar5 = request_2.taskInfo;
          pvVar4 = iface.impl;
          i_4.key = (char *)local_118;
          pRVar17 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                    ::operator->((unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                                  *)(request_2.inputID + 8));
          (*pTVar22->_vptr_Task[4])
                    (pTVar22,i_4.key,pvVar4,pTVar5,&pRVar17->key,request_2.inputID + 0x18);
          llbuild::TracingEngineTaskCallback::~TracingEngineTaskCallback
                    ((TracingEngineTaskCallback *)&iface.ctx);
        }
        else if (request_2.taskInfo != (TaskInfo *)0xffffffffffffffff) {
          __assert_fail("request.inputID == kMustFollowInputID",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                        ,0x374,
                        "bool (anonymous namespace)::BuildEngineImpl::executeTasks(const KeyType &)"
                       );
        }
        decrementTaskWaitCount(this,pTVar16);
        llbuild::TracingEngineQueueItemEvent::~TracingEngineQueueItemEvent
                  ((TracingEngineQueueItemEvent *)&request_2.orderOnly);
      }
      while (bVar6 = std::
                     deque<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                     ::empty(&this->readyTaskInfos), ((bVar6 ^ 0xffU) & 1) != 0) {
        pcVar10 = llbuild::core::KeyType::c_str(local_20);
        llbuild::TracingEngineQueueItemEvent::TracingEngineQueueItemEvent
                  ((TracingEngineQueueItemEvent *)&taskInfo,ReadyTask,pcVar10);
        bVar7 = true;
        ppTVar13 = std::
                   deque<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                   ::front(&this->readyTaskInfos);
        this_00 = *ppTVar13;
        std::
        deque<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
        ::pop_front(&this->readyTaskInfos);
        pRVar1 = this_00->forRuleInfo;
        pTVar16 = RuleInfo::getPendingTaskInfo(pRVar1);
        if (this_00 != pTVar16) {
          __assert_fail("taskInfo == ruleInfo->getPendingTaskInfo()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                        ,0x38c,
                        "bool (anonymous namespace)::BuildEngineImpl::executeTasks(const KeyType &)"
                       );
        }
        bVar6 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->trace);
        if (bVar6) {
          pBVar21 = std::
                    unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                    ::operator->(&this->trace);
          pTVar22 = std::unique_ptr<llbuild::core::Task,_std::default_delete<llbuild::core::Task>_>
                    ::get(&this_00->task);
          pRVar17 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                    ::get(&pRVar1->rule);
          llbuild::core::BuildEngineTrace::readiedTask(pBVar21,pTVar22,pRVar17);
        }
        RuleInfo::setComputing(pRVar1,this);
        uVar14 = llbuild::core::KeyID::operator_cast_to_unsigned_long(&pRVar1->keyID);
        llbuild::TracingEngineTaskCallback::TracingEngineTaskCallback
                  ((TracingEngineTaskCallback *)&iface_1.ctx,InputsAvailable,uVar14);
        pTVar22 = std::unique_ptr<llbuild::core::Task,_std::default_delete<llbuild::core::Task>_>::
                  get(&this_00->task);
        llbuild::core::TaskInterface::TaskInterface((TaskInterface *)local_158,this,pTVar22);
        pTVar22 = std::unique_ptr<llbuild::core::Task,_std::default_delete<llbuild::core::Task>_>::
                  operator->(&this_00->task);
        i_6.key = (char *)local_158;
        (*pTVar22->_vptr_Task[5])(pTVar22,local_158,iface_1.impl);
        llbuild::TracingEngineTaskCallback::~TracingEngineTaskCallback
                  ((TracingEngineTaskCallback *)&iface_1.ctx);
        this->numOutstandingUnfinishedTasks = this->numOutstandingUnfinishedTasks + 1;
        llbuild::TracingEngineQueueItemEvent::~TracingEngineQueueItemEvent
                  ((TracingEngineQueueItemEvent *)&taskInfo);
      }
      do {
        pcVar10 = llbuild::core::KeyType::c_str(local_20);
        llbuild::TracingEngineQueueItemEvent::TracingEngineQueueItemEvent
                  ((TracingEngineQueueItemEvent *)&taskInfo_1,FinishedTask,pcVar10);
        guard_1._M_device = (mutex_type *)0x0;
        std::lock_guard<std::mutex>::lock_guard
                  ((lock_guard<std::mutex> *)&ruleInfo_1,&this->finishedTaskInfosMutex);
        bVar6 = std::
                vector<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                ::empty(&this->finishedTaskInfos);
        if (!bVar6) {
          ppTVar15 = std::
                     vector<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                     ::back(&this->finishedTaskInfos);
          guard_1._M_device = (mutex_type *)*ppTVar15;
          std::
          vector<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
          ::pop_back(&this->finishedTaskInfos);
        }
        std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&ruleInfo_1);
        lVar3 = guard_1;
        if (guard_1._M_device == (mutex_type *)0x0) {
          cVar23 = '\r';
        }
        else {
          bVar7 = true;
          pRVar1 = *(RuleInfo **)((long)&guard_1._M_device[1].super___mutex_base._M_mutex + 0x10);
          pTVar16 = RuleInfo::getPendingTaskInfo(pRVar1);
          if ((TaskInfo *)lVar3._M_device != pTVar16) {
            __assert_fail("taskInfo == ruleInfo->getPendingTaskInfo()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                          ,0x3b5,
                          "bool (anonymous namespace)::BuildEngineImpl::executeTasks(const KeyType &)"
                         );
          }
          bVar6 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->trace);
          if (bVar6) {
            guard_2._M_device._7_1_ = (pRVar1->result).computedAt == this->currentEpoch;
            pBVar21 = std::
                      unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                      ::operator->(&this->trace);
            pTVar22 = std::
                      unique_ptr<llbuild::core::Task,_std::default_delete<llbuild::core::Task>_>::
                      get((unique_ptr<llbuild::core::Task,_std::default_delete<llbuild::core::Task>_>
                           *)guard_1._M_device);
            pRVar17 = std::
                      unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                      get(&pRVar1->rule);
            llbuild::core::BuildEngineTrace::finishedTask
                      (pBVar21,pTVar22,pRVar17,(bool)(guard_2._M_device._7_1_ & 1));
          }
          if (pRVar1->state != InProgressComputing) {
            __assert_fail("ruleInfo->state == RuleInfo::StateKind::InProgressComputing",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                          ,0x3c0,
                          "bool (anonymous namespace)::BuildEngineImpl::executeTasks(const KeyType &)"
                         );
          }
          RuleInfo::setPendingTaskInfo(pRVar1,(TaskInfo *)0x0);
          RuleInfo::setComplete(pRVar1,this);
          pRVar17 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                    ::operator->(&pRVar1->rule);
          (*pRVar17->_vptr_Rule[4])(pRVar17,this->buildEngine,2);
          llbuild::core::DependencyKeyIDs::append
                    (&(pRVar1->result).dependencies,
                     (DependencyKeyIDs *)
                     &guard_1._M_device[1].super___mutex_base._M_mutex.__data.__list.__next);
          std::lock_guard<std::mutex>::lock_guard
                    ((lock_guard<std::mutex> *)&__range4,&this->inputRequestsMutex);
          pp_Var18 = &guard_1._M_device[1].super___mutex_base._M_mutex.__data.__list.__next;
          join_0x00000010_0x00000000_ =
               llbuild::core::DependencyKeyIDs::begin((DependencyKeyIDs *)pp_Var18);
          join_0x00000010_0x00000000_ =
               llbuild::core::DependencyKeyIDs::end((DependencyKeyIDs *)pp_Var18);
          while (bVar6 = llbuild::core::DependencyKeyIDs::const_iterator::operator!=
                                   ((const_iterator *)&__end4.index,
                                    (const_iterator *)&dependency.orderOnly), bVar6) {
            KVar24 = llbuild::core::DependencyKeyIDs::const_iterator::operator*
                               ((const_iterator *)&__end4.index);
            local_1e0.keyID = KVar24.keyID._value;
            local_1d0 = local_1e0.keyID._value;
            local_1e0._8_2_ = KVar24._8_2_;
            dependency.keyID._value._0_1_ = local_1e0.orderOnly;
            dependency.keyID._value._1_1_ = local_1e0.singleUse;
            local_200.taskInfo = (TaskInfo *)0x0;
            local_200.inputID = 0;
            error.field_2._8_8_ = local_1e0.keyID._value;
            keyID._value = local_1e0.keyID._value;
            local_1e0 = KVar24;
            local_200.inputRuleInfo = getRuleInfoForKey(this,keyID);
            local_200.orderOnly = (bool)((byte)dependency.keyID._value & 1);
            local_200.forcePriorValue = false;
            local_200.singleUse = (bool)(dependency.keyID._value._1_1_ & 1);
            std::
            deque<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
            ::push_back(&this->inputRequests,&local_200);
            llbuild::core::DependencyKeyIDs::const_iterator::operator++
                      ((const_iterator *)&__end4.index);
          }
          std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range4);
          bVar6 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->db);
          if (bVar6) {
            std::__cxx11::string::string((string *)local_228);
            pBVar19 = std::
                      unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>
                      ::operator->(&this->db);
            local_238 = (pRVar1->keyID)._value;
            pRVar20 = std::
                      unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                      operator*(&pRVar1->rule);
            uVar8 = (*pBVar19->_vptr_BuildDB[6])
                              (pBVar19,local_238,pRVar20,&pRVar1->result,local_228);
            local_229 = (byte)uVar8 & 1;
            cVar23 = (uVar8 & 1) == 0;
            if ((bool)cVar23) {
              pBVar2 = this->delegate;
              llvm::Twine::Twine((Twine *)&__range4_1,(string *)local_228);
              (*pBVar2->_vptr_BuildEngineDelegate[7])();
              this->numOutstandingUnfinishedTasks = this->numOutstandingUnfinishedTasks - 1;
              cancelRemainingTasks(this);
              this_local._7_1_ = 0;
            }
            std::__cxx11::string::~string((string *)local_228);
            if ((bool)cVar23) goto LAB_0019ff84;
          }
          pp_Var18 = &((guard_1._M_device)->super___mutex_base)._M_mutex.__data.__list.__next;
          __end4_1 = std::
                     vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                     ::begin((vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                              *)pp_Var18);
          request_3 = (RuleScanRequest *)
                      std::
                      vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                      ::end((vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                             *)pp_Var18);
          while (bVar6 = __gnu_cxx::operator!=
                                   (&__end4_1,
                                    (__normal_iterator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>_>
                                     *)&request_3), bVar6) {
            __x = __gnu_cxx::
                  __normal_iterator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>_>
                  ::operator*(&__end4_1);
            std::
            vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
            ::push_back(&this->ruleInfosToScan,__x);
            __gnu_cxx::
            __normal_iterator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>_>
            ::operator++(&__end4_1);
          }
          bVar6 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->trace);
          if (bVar6) {
            this_02 = (vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                       *)((long)&((guard_1._M_device)->super___mutex_base)._M_mutex + 8);
            __end5 = std::
                     vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                     ::begin(this_02);
            request_4 = (TaskInputRequest *)
                        std::
                        vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                        ::end(this_02);
            while (bVar6 = __gnu_cxx::operator!=
                                     (&__end5,(__normal_iterator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>_>
                                               *)&request_4), bVar6) {
              local_290 = __gnu_cxx::
                          __normal_iterator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>_>
                          ::operator*(&__end5);
              pBVar21 = std::
                        unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                        ::operator->(&this->trace);
              pTVar22 = std::
                        unique_ptr<llbuild::core::Task,_std::default_delete<llbuild::core::Task>_>::
                        get(&local_290->taskInfo->task);
              pRVar17 = std::
                        unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                        get(&local_290->inputRuleInfo->rule);
              llbuild::core::BuildEngineTrace::readyingTaskInputRequest(pBVar21,pTVar22,pRVar17);
              __gnu_cxx::
              __normal_iterator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>_>
              ::operator++(&__end5);
            }
          }
          local_2a0._M_current =
               (TaskInputRequest *)
               std::
               vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
               ::end(&this->finishedInputRequests);
          __gnu_cxx::
          __normal_iterator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_const*,std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>>>
          ::__normal_iterator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest*>
                    ((__normal_iterator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_const*,std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>>>
                      *)&local_298,&local_2a0);
          __first = std::
                    vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                    ::begin((vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                             *)((long)&((guard_1._M_device)->super___mutex_base)._M_mutex + 8));
          __last = std::
                   vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                   ::end((vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                          *)((long)&((guard_1._M_device)->super___mutex_base)._M_mutex + 8));
          std::
          vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>>
          ::
          insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest*,std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>>>,void>
                    ((vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>>
                      *)&this->finishedInputRequests,local_298,
                     (__normal_iterator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>_>
                      )__first._M_current,
                     (__normal_iterator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>_>
                      )__last._M_current);
          this->numOutstandingUnfinishedTasks = this->numOutstandingUnfinishedTasks - 1;
          std::lock_guard<std::mutex>::lock_guard
                    ((lock_guard<std::mutex> *)&it,&this->taskInfosMutex);
          local_2d0 = std::
                      unique_ptr<llbuild::core::Task,_std::default_delete<llbuild::core::Task>_>::
                      get((unique_ptr<llbuild::core::Task,_std::default_delete<llbuild::core::Task>_>
                           *)guard_1._M_device);
          local_2c8._M_cur =
               (__node_type *)
               std::
               unordered_map<llbuild::core::Task_*,_(anonymous_namespace)::BuildEngineImpl::TaskInfo,_std::hash<llbuild::core::Task_*>,_std::equal_to<llbuild::core::Task_*>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>_>
               ::find(&this->taskInfos,&local_2d0);
          local_2d8._M_cur =
               (__node_type *)
               std::
               unordered_map<llbuild::core::Task_*,_(anonymous_namespace)::BuildEngineImpl::TaskInfo,_std::hash<llbuild::core::Task_*>,_std::equal_to<llbuild::core::Task_*>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>_>
               ::end(&this->taskInfos);
          bVar6 = std::__detail::operator!=(&local_2c8,&local_2d8);
          if (!bVar6) {
            __assert_fail("it != taskInfos.end()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                          ,0x406,
                          "bool (anonymous namespace)::BuildEngineImpl::executeTasks(const KeyType &)"
                         );
          }
          std::
          unordered_map<llbuild::core::Task_*,_(anonymous_namespace)::BuildEngineImpl::TaskInfo,_std::hash<llbuild::core::Task_*>,_std::equal_to<llbuild::core::Task_*>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>_>
          ::erase(&this->taskInfos,(iterator)local_2c8._M_cur);
          std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&it);
          cVar23 = '\0';
        }
LAB_0019ff84:
        llbuild::TracingEngineQueueItemEvent::~TracingEngineQueueItemEvent
                  ((TracingEngineQueueItemEvent *)&taskInfo_1);
      } while (cVar23 == '\0');
      if (cVar23 == '\x01') goto LAB_001a00b3;
      if ((!bVar7) && (this->numOutstandingUnfinishedTasks != 0)) {
        pcVar10 = llbuild::core::KeyType::c_str(local_20);
        llbuild::TracingEngineQueueItemEvent::TracingEngineQueueItemEvent
                  ((TracingEngineQueueItemEvent *)&lock._M_owns,Waiting,pcVar10);
        std::unique_lock<std::mutex>::unique_lock
                  ((unique_lock<std::mutex> *)local_300,&this->finishedTaskInfosMutex);
        bVar7 = std::
                vector<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                ::empty(&this->finishedTaskInfos);
        if (bVar7) {
          std::condition_variable::wait((unique_lock *)&this->finishedTaskInfosCondition);
        }
        bVar7 = true;
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_300);
        llbuild::TracingEngineQueueItemEvent::~TracingEngineQueueItemEvent
                  ((TracingEngineQueueItemEvent *)&lock._M_owns);
      }
    } while (bVar7);
    bVar7 = std::
            unordered_map<llbuild::core::Task_*,_(anonymous_namespace)::BuildEngineImpl::TaskInfo,_std::hash<llbuild::core::Task_*>,_std::equal_to<llbuild::core::Task_*>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>_>
            ::empty(&this->taskInfos);
    if (bVar7) {
      this_local._7_1_ = 1;
      goto LAB_001a00b3;
    }
    bVar7 = resolveCycle(this,local_20);
    if (!bVar7) {
      cancelRemainingTasks(this);
      this_local._7_1_ = 0;
LAB_001a00b3:
      return (bool)(this_local._7_1_ & 1);
    }
  } while( true );
}

Assistant:

bool executeTasks(const KeyType& buildKey) {
    // Clear any previous build state
    finishedInputRequests.clear();

    // Push a dummy input request for the rule to build.
    inputRequests.push_back({ nullptr, 0, &getRuleInfoForKey(buildKey), false, false, false });

    // Process requests as long as we have work to do.
    while (true) {
      bool didWork = false;

      // Cancel the build, if requested.
      if (buildCancelled) {
        // Force completion of all outstanding tasks.
        cancelRemainingTasks();
        return false;
      }

      // Process all of the pending rule scan requests.
      //
      // FIXME: We don't want to process all of these requests, this amounts to
      // doing all of the dependency scanning up-front.
      while (!ruleInfosToScan.empty()) {
        TracingEngineQueueItemEvent i(EngineQueueItemKind::RuleToScan, buildKey.c_str());

        didWork = true;

        auto request = ruleInfosToScan.back();
        ruleInfosToScan.pop_back();

        processRuleScanRequest(request);
      }

      // Process all of the pending input requests.
      while (true) {
        TracingEngineQueueItemEvent i(EngineQueueItemKind::InputRequest, buildKey.c_str());

        TaskInputRequest request;
        bool found = false;
        {
          std::lock_guard<std::mutex> guard(inputRequestsMutex);
          if (!inputRequests.empty()) {
            // IMPORTANT: Dependency recording below relies on the assumption
            // that we will process input requests in FIFO order. DO NOT CHANGE
            // this without adjusting for this expectation.
            request = inputRequests.front();
            inputRequests.pop_front();
            found = true;
          }
        }
        if (!found)
          break;

        didWork = true;

        if (trace) {
          if (request.taskInfo) {
            trace->handlingTaskInputRequest(request.taskInfo->task.get(),
                                            request.inputRuleInfo->rule.get());
          } else {
            trace->handlingBuildInputRequest(request.inputRuleInfo->rule.get());
          }
        }

        // Request the input rule be scanned.
        bool isScanned = scanRule(*request.inputRuleInfo);

        // If the rule is not yet scanned, suspend this input request.
        if (!isScanned) {
          assert(request.inputRuleInfo->isScanning());
          if (trace)
            trace->pausedInputRequestForRuleScan(
              request.inputRuleInfo->rule.get());
          request.inputRuleInfo->getPendingScanRecord()
            ->pausedInputRequests.push_back(request);
          continue;
        }

        // Request the input rule be computed.
        bool isAvailable = demandRule(*request.inputRuleInfo);

        // If this is a dummy input request, we are done.
        if (!request.taskInfo)
          continue;

        // Update the recorded dependencies of this task.
        //
        // FIXME: This is very performance critical and should be highly
        // optimized. By itself, this addition added about 25% user time to the
        // "ack 3 16" experiment.
        //
        // There are multiple options for when to record these dependencies:
        // 1. Record at the time it is requested.
        // 2. Record at the time it is popped off the input request queue.
        // 3. Record at the time the input is supplied.
        //
        // Here we have chosen option 2 for two reasons. First, we want to avoid
        // the need to synchronize concurrent access to the rule info data
        // structure, therefore we want to perform this work on the engine
        // thread (and as such rules out option 1).
        //
        // Second, we explicitly wish to record dependencies in the order in
        // which they have been requested by the task/client. This ensures that
        // dependencies will be recorded in a deterministic order that is under
        // client control. This can be important for performance in subsequent
        // incremental builds, where scanning order is important for discovering
        // work.
        //
        // NOTE: In order to achieve the latter, we rely processing input
        // requests in FIFO order.
        //
        request.taskInfo->forRuleInfo->result.dependencies.push_back(
            request.inputRuleInfo->keyID, request.orderOnly, request.singleUse);


        // If the rule is already available, enqueue the finalize request.
        if (isAvailable) {
          if (trace)
            trace->readyingTaskInputRequest(request.taskInfo->task.get(),
                                            request.inputRuleInfo->rule.get());
          finishedInputRequests.push_back(request);
        } else {
          // Otherwise, record the pending input request.
          assert(request.inputRuleInfo->getPendingTaskInfo());
          if (trace)
            trace->addedRulePendingTask(request.inputRuleInfo->rule.get(),
                                        request.taskInfo->task.get());
          request.inputRuleInfo->getPendingTaskInfo()->requestedBy.push_back(
            request);
        }
      }

      // Process all of the finished inputs.
      while (!finishedInputRequests.empty()) {
        TracingEngineQueueItemEvent i(EngineQueueItemKind::FinishedInputRequest, buildKey.c_str());

        didWork = true;

        auto request = finishedInputRequests.back();
        finishedInputRequests.pop_back();

        if (trace)
          trace->completedTaskInputRequest(request.taskInfo->task.get(),
                                           request.inputRuleInfo->rule.get());

        // Otherwise, we are processing a regular input dependency.

        // Provide the requesting task with the input.
        //
        // FIXME: Should we provide the input key here? We have it available
        // cheaply.
        assert(request.inputRuleInfo->isComplete(this) || request.forcePriorValue || request.orderOnly);
        if (request.orderOnly) {
          assert(request.inputID == kMustFollowInputID);
        } else {
          TracingEngineTaskCallback i(EngineTaskCallbackKind::ProvideValue, request.inputRuleInfo->keyID);
          TaskInterface iface{this, request.taskInfo->task.get()};
          request.taskInfo->task->provideValue(
              iface, request.inputID, request.inputRuleInfo->rule->key, request.inputRuleInfo->result.value);
        }

        // Decrement the wait count, and move to finish queue if necessary.
        decrementTaskWaitCount(request.taskInfo);
      }

      // Process all of the ready to run tasks.
      while (!readyTaskInfos.empty()) {
        TracingEngineQueueItemEvent i(EngineQueueItemKind::ReadyTask, buildKey.c_str());

        didWork = true;

        // Process ready tasks FIFO to preserve the relative ordering they were
        // requested by tasks above.
        TaskInfo* taskInfo = readyTaskInfos.front();
        readyTaskInfos.pop_front();

        RuleInfo* ruleInfo = taskInfo->forRuleInfo;
        assert(taskInfo == ruleInfo->getPendingTaskInfo());

        if (trace)
            trace->readiedTask(taskInfo->task.get(), ruleInfo->rule.get());

        // Transition the rule state.
        ruleInfo->setComputing(this);

        // Inform the task its inputs are ready and it should finish.
        //
        // FIXME: We need to track this state, and generate an error if this
        // task ever requests additional inputs.
        {
          TracingEngineTaskCallback i(EngineTaskCallbackKind::InputsAvailable, ruleInfo->keyID);
          TaskInterface iface{this, taskInfo->task.get()};
          taskInfo->task->inputsAvailable(iface);
        }

        // Increment our count of outstanding tasks.
        ++numOutstandingUnfinishedTasks;
      }

      // Process all of the finished tasks.
      while (true) {
        TracingEngineQueueItemEvent i(EngineQueueItemKind::FinishedTask, buildKey.c_str());

        // Try to take a task from the finished queue.
        TaskInfo* taskInfo = nullptr;
        {
          std::lock_guard<std::mutex> guard(finishedTaskInfosMutex);
          if (!finishedTaskInfos.empty()) {
            taskInfo = finishedTaskInfos.back();
            finishedTaskInfos.pop_back();
          }
        }
        if (!taskInfo)
          break;

        didWork = true;

        RuleInfo* ruleInfo = taskInfo->forRuleInfo;
        assert(taskInfo == ruleInfo->getPendingTaskInfo());

        // The task was changed if was computed in the current iteration.
        if (trace) {
          bool wasChanged = ruleInfo->result.computedAt == currentEpoch;
          trace->finishedTask(taskInfo->task.get(), ruleInfo->rule.get(),
                              wasChanged);
        }

        // Transition the rule state by completing the rule (the value itself is
        // stored in the taskIsFinished call).
        assert(ruleInfo->state == RuleInfo::StateKind::InProgressComputing);
        ruleInfo->setPendingTaskInfo(nullptr);
        ruleInfo->setComplete(this);

        // Report the status change.
        ruleInfo->rule->updateStatus(buildEngine, Rule::StatusKind::IsComplete);

        // Add all of the task's discovered dependencies.
        //
        // FIXME: We could audit these dependencies at this point to verify that
        // they are not keys for rules which have not been run, which would
        // indicate an underspecified build (e.g., a generated header).
        ruleInfo->result.dependencies.append(taskInfo->discoveredDependencies);

        // Push back dummy input requests for any discovered dependencies, which
        // must be at least built in order to be brought up-to-date.
        //
        // FIXME: The need to do this makes it questionable that we use this
        // approach for discovered dependencies instead of just providing
        // support for request() even after the task has started computing and
        // from parallel contexts.
        {
          std::lock_guard<std::mutex> guard(inputRequestsMutex);
          for (auto dependency: taskInfo->discoveredDependencies) {
            inputRequests.push_back({ nullptr, 0, &getRuleInfoForKey(dependency.keyID), dependency.orderOnly, false , dependency.singleUse});
          }
        }

        // Update the database record, if attached.
        if (db) {
          std::string error;
          bool result = db->setRuleResult(
              ruleInfo->keyID, *ruleInfo->rule, ruleInfo->result, &error);
          if (!result) {
            delegate.error(error);

            // Decrement our count of outstanding tasks. This must be done prior
            // the subsequent synchronous cancellation, since it will otherwise
            // deadlock waiting for the task we have already popped off the
            // queue. rdar://problem/50203529
            --numOutstandingUnfinishedTasks;

            cancelRemainingTasks();
            return false;
          }
        }

        // Wake up all of the pending scan requests.
        for (const auto& request: taskInfo->deferredScanRequests) {
          ruleInfosToScan.push_back(request);
        }

        // Push all pending input requests onto the work queue.
        if (trace) {
          for (auto& request: taskInfo->requestedBy) {
            trace->readyingTaskInputRequest(request.taskInfo->task.get(),
                                            request.inputRuleInfo->rule.get());
          }
        }
        finishedInputRequests.insert(finishedInputRequests.end(),
                                     taskInfo->requestedBy.begin(),
                                     taskInfo->requestedBy.end());

        // Decrement our count of outstanding tasks.
        --numOutstandingUnfinishedTasks;

        // Delete the pending task.
        {
          std::lock_guard<std::mutex> guard(taskInfosMutex);
          auto it = taskInfos.find(taskInfo->task.get());
          assert(it != taskInfos.end());
          taskInfos.erase(it);
        }
      }

      // If we haven't done any other work at this point but we have pending
      // tasks, we need to wait for a task to complete.
      //
      // NOTE: Cancellation also implements this process, if you modify this
      // code please also validate that \see cancelRemainingTasks() is still
      // correct.
      if (!didWork && numOutstandingUnfinishedTasks != 0) {
        TracingEngineQueueItemEvent i(EngineQueueItemKind::Waiting, buildKey.c_str());

        // Wait for our condition variable.
        std::unique_lock<std::mutex> lock(finishedTaskInfosMutex);

        // Ensure we still don't have enqueued operations under the protection
        // of the mutex, if one has been added then we may have already missed
        // the condition notification and cannot safely wait.
        if (finishedTaskInfos.empty()) {
          finishedTaskInfosCondition.wait(lock);
        }

        didWork = true;
      }

      if (!didWork) {
        // If there was no work to do, but we still have running tasks, then
        // we have found a cycle. Try to resolve it and continue.
        if (!taskInfos.empty()) {
          if (resolveCycle(buildKey)) {
            continue;
          } else {
            cancelRemainingTasks();
            return false;
          }
        }

        // We didn't do any work, and we have nothing more we can/need to do.
        break;
      }
    }

    return true;
  }